

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Int64Parameter::clear_AllowedValues(Int64Parameter *this)

{
  if (((this->_oneof_case_[0] == 0xb) || (this->_oneof_case_[0] == 10)) &&
     ((this->AllowedValues_).range_ != (Int64Range *)0x0)) {
    (*(((this->AllowedValues_).range_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Int64Parameter::clear_AllowedValues() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Int64Parameter)
  switch (AllowedValues_case()) {
    case kRange: {
      delete AllowedValues_.range_;
      break;
    }
    case kSet: {
      delete AllowedValues_.set_;
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = ALLOWEDVALUES_NOT_SET;
}